

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator=
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  double *pdVar1;
  double *pdVar2;
  pointer __p;
  int64_t i;
  ulong uVar3;
  long lVar4;
  pointer local_20;
  
  lVar4 = matrix->size_;
  if (lVar4 != this->size_) {
    this->size_ = lVar4;
    alloc_unique_array<double>((dense *)&local_20,lVar4 * lVar4);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
              ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&this->data_,__p);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_20);
    lVar4 = this->size_;
  }
  pdVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  pdVar2 = (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (uVar3 = 0; uVar3 < (ulong)(lVar4 * lVar4); uVar3 = uVar3 + 1) {
    pdVar2[uVar3] = pdVar1[uVar3];
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }